

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

lbool __thiscall Minisat::Solver::solve_(Solver *this)

{
  lbool lVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  double dVar8;
  
  if ((this->model).data != (lbool *)0x0) {
    (this->model).sz = 0;
  }
  IntSet<Minisat::Lit,_Minisat::MkIndexLit>::clear
            (&(this->conflict).super_IntSet<Minisat::Lit,_Minisat::MkIndexLit>,false);
  lVar1.value = l_False;
  if (this->ok != false) {
    this->solves = this->solves + 1;
    dVar8 = (double)(int)this->num_clauses * this->learntsize_factor;
    this->max_learnts = dVar8;
    if (dVar8 < (double)this->min_learnts_lim) {
      this->max_learnts = (double)this->min_learnts_lim;
    }
    this->learntsize_adjust_confl = (double)this->learntsize_adjust_start_confl;
    this->learntsize_adjust_cnt = this->learntsize_adjust_start_confl;
    lVar1.value = l_Undef;
    if (0 < this->verbosity) {
      puts("============================[ Search Statistics ]==============================");
      puts("| Conflicts |          ORIGINAL         |          LEARNT          | Progress |");
      puts("|           |    Vars  Clauses Literals |    Limit  Clauses Lit/Cl |          |");
      puts("===============================================================================");
    }
    iVar6 = 0;
    do {
      if ((lVar1.value != l_Undef || (l_Undef & 2) != 0) && (l_Undef & 2 & lVar1.value) == 0) break;
      if (this->luby_restart == true) {
        if (iVar6 == 0) {
          iVar5 = 0;
          iVar3 = 0;
        }
        else {
          iVar4 = 1;
          iVar3 = 0;
          do {
            iVar3 = iVar3 + 1;
            iVar5 = iVar4 * 2;
            iVar4 = iVar4 * 2 + 1;
          } while (iVar5 < iVar6);
        }
        dVar8 = this->restart_inc;
        iVar4 = iVar6;
        if (iVar5 != iVar6) {
          do {
            iVar3 = iVar3 + -1;
            iVar4 = iVar4 % (iVar5 >> 1);
            iVar5 = (iVar5 >> 1) + -1;
          } while (iVar5 != iVar4);
        }
      }
      else {
        dVar8 = this->restart_inc;
        iVar3 = iVar6;
      }
      dVar8 = pow(dVar8,(double)iVar3);
      lVar1 = search(this,(int)((double)this->restart_first * dVar8));
      if ((this->asynch_interrupt == false) &&
         ((this->conflict_budget < 0 || (this->conflicts < (ulong)this->conflict_budget)))) {
        if (this->propagation_budget < 0) {
          bVar7 = true;
        }
        else {
          bVar7 = this->propagations < (ulong)this->propagation_budget;
        }
      }
      else {
        bVar7 = false;
      }
      iVar6 = iVar6 + (uint)bVar7;
    } while (bVar7 != false);
    if (0 < this->verbosity) {
      puts("===============================================================================");
    }
    if (lVar1.value == l_True && (l_True & 2) == 0 || (l_True & 2 & lVar1.value) != 0) {
      vec<Minisat::lbool,_int>::growTo(&this->model,this->next_var);
      if (0 < this->next_var) {
        lVar2 = 0;
        do {
          if ((this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.
              sz <= lVar2) {
            __assert_fail("has(k)",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                          ,0x27,
                          "const V &Minisat::IntMap<int, Minisat::lbool>::operator[](K) const [K = int, V = Minisat::lbool, MkIndex = Minisat::MkIndexDefault<int>]"
                         );
          }
          (this->model).data[lVar2].value =
               (this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.
               data[lVar2].value;
          lVar2 = lVar2 + 1;
        } while (lVar2 < this->next_var);
      }
    }
    else if ((lVar1.value == l_False && (l_False & 2) == 0 || (l_False & 2 & lVar1.value) != 0) &&
            ((this->conflict).super_IntSet<Minisat::Lit,_Minisat::MkIndexLit>.xs.sz == 0)) {
      this->ok = false;
    }
    cancelUntil(this,0);
  }
  return (lbool)lVar1.value;
}

Assistant:

lbool Solver::solve_()
{
    model.clear();
    conflict.clear();
    if (!ok) return l_False;

    solves++;

    max_learnts = nClauses() * learntsize_factor;
    if (max_learnts < min_learnts_lim)
        max_learnts = min_learnts_lim;

    learntsize_adjust_confl   = learntsize_adjust_start_confl;
    learntsize_adjust_cnt     = (int)learntsize_adjust_confl;
    lbool   status            = l_Undef;

    if (verbosity >= 1){
        printf("============================[ Search Statistics ]==============================\n");
        printf("| Conflicts |          ORIGINAL         |          LEARNT          | Progress |\n");
        printf("|           |    Vars  Clauses Literals |    Limit  Clauses Lit/Cl |          |\n");
        printf("===============================================================================\n");
    }

    // Search:
    int curr_restarts = 0;
    while (status == l_Undef){
        double rest_base = luby_restart ? luby(restart_inc, curr_restarts) : pow(restart_inc, curr_restarts);
        status = search(rest_base * restart_first);
        if (!withinBudget()) break;
        curr_restarts++;
    }

    if (verbosity >= 1)
        printf("===============================================================================\n");


    if (status == l_True){
        // Extend & copy model:
        model.growTo(nVars());
        for (int i = 0; i < nVars(); i++) model[i] = value(i);
    }else if (status == l_False && conflict.size() == 0)
        ok = false;

    cancelUntil(0);
    return status;
}